

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

Literal * __thiscall wasm::Literal::castToF32(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *ret;
  
  if ((this->type).id == 2) {
    (__return_storage_ptr__->type).id = 4;
    (__return_storage_ptr__->field_0).i32 = (this->field_0).i32;
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x154,"Literal wasm::Literal::castToF32()");
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }